

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

void __thiscall
propset_token_source::insert_token(propset_token_source *this,tc_toktyp_t typ,char *txt,size_t len)

{
  propset_tok *ppVar1;
  propset_tok **pppVar2;
  
  ppVar1 = (propset_tok *)CTcPrsMem::alloc(G_prsmem,0x30);
  (ppVar1->tok).typ_ = typ;
  (ppVar1->tok).text_ = txt;
  (ppVar1->tok).text_len_ = len;
  ppVar1->nxt = (propset_tok *)0x0;
  pppVar2 = &this->last_tok->nxt;
  if (this->last_tok == (propset_tok *)0x0) {
    pppVar2 = &this->nxt_tok;
  }
  *pppVar2 = ppVar1;
  this->last_tok = ppVar1;
  return;
}

Assistant:

void propset_token_source::insert_token(
    tc_toktyp_t typ, const char *txt, size_t len)
{
    /* set up the token object */
    CTcToken tok;
    tok.settyp(typ);
    tok.set_text(txt, len);

    /* insert it */
    insert_token(&tok);
}